

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_DEF(Context *ctx)

{
  uint uVar1;
  int in_ECX;
  size_t in_RDX;
  char val3 [32];
  char val2 [32];
  char val1 [32];
  char val0 [32];
  char varname [64];
  
  get_METAL_destarg_varname(ctx,varname,in_RDX);
  floatstr(ctx,val0,1,(float)ctx->dwords[0],in_ECX);
  floatstr(ctx,val1,1,(float)ctx->dwords[1],in_ECX);
  floatstr(ctx,val2,1,(float)ctx->dwords[2],in_ECX);
  floatstr(ctx,val3,1,(float)ctx->dwords[3],in_ECX);
  push_output(ctx,&ctx->mainline_top);
  ctx->indent = ctx->indent + 1;
  output_line(ctx,"const float4 %s = float4(%s, %s, %s, %s); (void) %s;",varname,val0,val1,val2,val3
              ,varname);
  if (0 < ctx->output_stack_len) {
    uVar1 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar1;
    ctx->output = ctx->output_stack[uVar1];
    ctx->indent = ctx->indent_stack[uVar1];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_METAL_DEF(Context *ctx)
{
    const float *val = (const float *) ctx->dwords; // !!! FIXME: could be int?
    char varname[64]; get_METAL_destarg_varname(ctx, varname, sizeof (varname));
    char val0[32]; floatstr(ctx, val0, sizeof (val0), val[0], 1);
    char val1[32]; floatstr(ctx, val1, sizeof (val1), val[1], 1);
    char val2[32]; floatstr(ctx, val2, sizeof (val2), val[2], 1);
    char val3[32]; floatstr(ctx, val3, sizeof (val3), val[3], 1);

    push_output(ctx, &ctx->mainline_top);
    ctx->indent++;
    // The "(void) %s;" is to make the compiler not warn if this isn't used.
    output_line(ctx, "const float4 %s = float4(%s, %s, %s, %s); (void) %s;",
                varname, val0, val1, val2, val3, varname);
    pop_output(ctx);
}